

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall
SmallArray<CompilerStatistics::Timer,_16U>::SmallArray
          (SmallArray<CompilerStatistics::Timer,_16U> *this,Allocator *allocator)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = 0x10;
  do {
    *(undefined4 *)((long)&this->little[0].outputName.begin + lVar2) = 0;
    puVar1 = (undefined8 *)((long)&this->little[0].keyName.begin + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)this->little + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x290);
  this->allocator = allocator;
  this->data = this->little;
  this->count = 0;
  this->max = 0x10;
  return;
}

Assistant:

SmallArray(Allocator *allocator = 0): allocator(allocator)
	{
		data = little;
		max = N;

		count = 0;
	}